

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cpp
# Opt level: O0

int LUDecompose(double **a,int n,double *vv,int *indx,double *pd)

{
  undefined8 uVar1;
  long lVar2;
  double dVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  ulong *in_R8;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double d;
  double temp;
  double sum;
  double dum;
  double big;
  int k;
  int j;
  int imax;
  int i;
  ulong local_68;
  ulong local_58;
  double local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_68 = 0x3ff0000000000000;
  local_34 = 0;
  while( true ) {
    if (in_ESI <= local_34) {
      for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
        for (local_34 = 0; local_34 < local_3c; local_34 = local_34 + 1) {
          local_58 = *(ulong *)(*(long *)(in_RDI + (long)local_34 * 8) + (long)local_3c * 8);
          for (local_40 = 0; local_40 < local_34; local_40 = local_40 + 1) {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(*(long *)(in_RDI + (long)local_40 * 8) + (long)local_3c * 8);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = local_58;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)(*(long *)(in_RDI + (long)local_34 * 8) + (long)local_40 * 8) ^
                           0x8000000000000000;
            auVar5 = vfmadd213sd_fma(auVar5,auVar8,auVar11);
            local_58 = auVar5._0_8_;
          }
          *(ulong *)(*(long *)(in_RDI + (long)local_34 * 8) + (long)local_3c * 8) = local_58;
        }
        local_48 = 0.0;
        for (local_34 = local_3c; local_34 < in_ESI; local_34 = local_34 + 1) {
          local_58 = *(ulong *)(*(long *)(in_RDI + (long)local_34 * 8) + (long)local_3c * 8);
          for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(*(long *)(in_RDI + (long)local_40 * 8) + (long)local_3c * 8);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = local_58;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)(*(long *)(in_RDI + (long)local_34 * 8) + (long)local_40 * 8) ^
                           0x8000000000000000;
            auVar5 = vfmadd213sd_fma(auVar6,auVar9,auVar12);
            local_58 = auVar5._0_8_;
          }
          *(ulong *)(*(long *)(in_RDI + (long)local_34 * 8) + (long)local_3c * 8) = local_58;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_58;
          auVar13._8_8_ = 0x7fffffffffffffff;
          auVar13._0_8_ = 0x7fffffffffffffff;
          auVar5 = vpand_avx(auVar10,auVar13);
          dVar3 = *(double *)(in_RDX + (long)local_34 * 8) * auVar5._0_8_;
          if (local_48 <= dVar3) {
            local_38 = local_34;
            local_48 = dVar3;
          }
        }
        if (local_3c != local_38) {
          for (local_40 = 0; local_40 < in_ESI; local_40 = local_40 + 1) {
            uVar1 = *(undefined8 *)(*(long *)(in_RDI + (long)local_38 * 8) + (long)local_40 * 8);
            *(undefined8 *)(*(long *)(in_RDI + (long)local_38 * 8) + (long)local_40 * 8) =
                 *(undefined8 *)(*(long *)(in_RDI + (long)local_3c * 8) + (long)local_40 * 8);
            *(undefined8 *)(*(long *)(in_RDI + (long)local_3c * 8) + (long)local_40 * 8) = uVar1;
          }
          local_68 = local_68 ^ 0x8000000000000000;
          *(undefined8 *)(in_RDX + (long)local_38 * 8) =
               *(undefined8 *)(in_RDX + (long)local_3c * 8);
        }
        *(int *)(in_RCX + (long)local_3c * 4) = local_38;
        dVar3 = *(double *)(*(long *)(in_RDI + (long)local_3c * 8) + (long)local_3c * 8);
        if ((dVar3 == 0.0) && (!NAN(dVar3))) {
          *(undefined8 *)(*(long *)(in_RDI + (long)local_3c * 8) + (long)local_3c * 8) =
               0x3bc79ca10c924223;
        }
        if (local_3c != in_ESI + -1) {
          dVar3 = *(double *)(*(long *)(in_RDI + (long)local_3c * 8) + (long)local_3c * 8);
          local_34 = local_3c;
          while (local_34 = local_34 + 1, local_34 < in_ESI) {
            lVar2 = *(long *)(in_RDI + (long)local_34 * 8);
            *(double *)(lVar2 + (long)local_3c * 8) =
                 (1.0 / dVar3) * *(double *)(lVar2 + (long)local_3c * 8);
          }
        }
      }
      if (in_R8 != (ulong *)0x0) {
        *in_R8 = local_68;
      }
      return 0;
    }
    local_48 = 0.0;
    for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(*(long *)(in_RDI + (long)local_34 * 8) + (long)local_3c * 8);
      auVar7._8_8_ = 0x7fffffffffffffff;
      auVar7._0_8_ = 0x7fffffffffffffff;
      auVar5 = vpand_avx(auVar4,auVar7);
      if (local_48 < auVar5._0_8_) {
        local_48 = auVar5._0_8_;
      }
    }
    if ((local_48 == 0.0) && (!NAN(local_48))) break;
    *(double *)(in_RDX + (long)local_34 * 8) = 1.0 / local_48;
    local_34 = local_34 + 1;
  }
  printf("singular matrix in routine LUDecompose");
  return 1;
}

Assistant:

int LUDecompose (double **a, int n, double *vv, int *indx, double *pd)
	/*   **a = the matrix whose LU-decomposition is wanted                    */
	/*     n = order of a                                                     */
	/*   *vv = work vector of size n (stores implicit scaling of each row)    */
	/* *indx => row permutation according to partial pivoting sequence        */
	/*   *pd => 1 if number of row interchanges was even, -1 if odd (NULL OK) */
{
	int			i, imax, j, k;
	double		big, dum, sum, temp, d;

	d = 1.0;
	for (i = 0; i < n; i++)
		{
		big = 0.0;
		for (j = 0; j < n; j++)
			{
			if ((temp = fabs(a[i][j])) > big)
				big = temp;
			}
		if (big == 0.0)
			{
			printf("singular matrix in routine LUDecompose");
			return ERROR;
			}
		vv[i] = ONE_POINT_ZERO / big;
		}
	for (j = 0; j < n; j++)
		{
		for (i = 0; i < j; i++)
			{
			sum = a[i][j];
			for (k = 0; k < i; k++)
				sum -= a[i][k] * a[k][j];
			a[i][j] = sum;
			}
		big = 0.0;
		for (i = j; i < n; i++)
			{
			sum = a[i][j];
			for (k = 0; k < j; k++)
				sum -= a[i][k] * a[k][j];
			a[i][j] = sum;
			dum = vv[i] * fabs(sum);
			if (dum >= big)
				{
				big = dum;
				imax = i;
				}
			}
		if (j != imax)
			{
			for (k = 0; k < n; k++)
				{
				dum = a[imax][k];
				a[imax][k] = a[j][k];
				a[j][k] = dum;
				}	
			d = -d;
			vv[imax] = vv[j];
			}
		indx[j] = imax;
		if (a[j][j] == 0.0)
			a[j][j] = TINY;
		if (j != n - 1)
			{
			dum = ONE_POINT_ZERO / (a[j][j]);
			for (i = j + 1; i < n; i++)
				a[i][j] *= dum;
			}
		}

	if (pd != NULL)
		*pd = d;
	return NO_ERROR;
}